

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  uchar *puVar1;
  uchar uVar5;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uchar uVar8;
  size_t sVar6;
  LodePNGColorMode *pLVar7;
  uint bits;
  uchar uVar9;
  uchar uVar10;
  unsigned_short grey;
  uchar uVar12;
  ulong uVar11;
  long lVar13;
  ulong uVar14;
  long lVar15;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *local_d0;
  ulong local_c8;
  LodePNGColorMode *local_c0;
  ColorTree tree;
  
  iVar2 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar2 != 0) {
    sVar4 = lodepng_get_raw_size(w,h,mode_in);
    for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
      out[sVar6] = in[sVar6];
    }
    return 0;
  }
  local_c8 = (ulong)(h * w);
  local_d0 = out;
  local_c0 = mode_in;
  if (mode_out->colortype == LCT_PALETTE) {
    uVar11 = 1L << ((byte)mode_out->bitdepth & 0x3f);
    uVar14 = mode_out->palettesize;
    pLVar7 = mode_out;
    if (uVar14 == 0) {
      uVar14 = mode_in->palettesize;
      pLVar7 = mode_in;
    }
    puVar1 = pLVar7->palette;
    if (uVar14 < uVar11) {
      uVar11 = uVar14;
    }
    color_tree_init(&tree);
    for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
      color_tree_add(&tree,puVar1[uVar14 * 4],puVar1[uVar14 * 4 + 1],puVar1[uVar14 * 4 + 2],
                     puVar1[uVar14 * 4 + 3],(uint)uVar14);
    }
  }
  puVar1 = local_d0;
  if (mode_out->bitdepth == 0x10 && local_c0->bitdepth == 0x10) {
    lVar13 = 5;
    for (sVar4 = 0; local_c8 != sVar4; sVar4 = sVar4 + 1) {
      r = 0;
      g = 0;
      b = 0;
      a = 0;
      getPixelColorRGBA16(&r,&g,&b,&a,in,sVar4,local_c0);
      uVar10 = (uchar)r;
      uVar12 = (uchar)(r >> 8);
      uVar8 = (uchar)(a >> 8);
      uVar9 = (uchar)(g >> 8);
      uVar5 = (uchar)(b >> 8);
      switch(mode_out->colortype) {
      case LCT_GREY:
        *(unsigned_short *)(local_d0 + sVar4 * 2) = r << 8 | r >> 8;
        break;
      case LCT_RGB:
        local_d0[lVar13 + -5] = uVar12;
        local_d0[lVar13 + -4] = uVar10;
        local_d0[lVar13 + -3] = uVar9;
        local_d0[lVar13 + -2] = (uchar)g;
        local_d0[lVar13 + -1] = uVar5;
        local_d0[lVar13] = (uchar)b;
        break;
      case LCT_GREY_ALPHA:
        local_d0[sVar4 * 4] = uVar12;
        local_d0[sVar4 * 4 + 1] = uVar10;
        local_d0[sVar4 * 4 + 2] = uVar8;
        local_d0[sVar4 * 4 + 3] = (uchar)a;
        break;
      case LCT_RGBA:
        local_d0[sVar4 * 8] = uVar12;
        local_d0[sVar4 * 8 + 1] = uVar10;
        local_d0[sVar4 * 8 + 2] = uVar9;
        local_d0[sVar4 * 8 + 3] = (uchar)g;
        local_d0[sVar4 * 8 + 4] = uVar5;
        local_d0[sVar4 * 8 + 5] = (uchar)b;
        local_d0[sVar4 * 8 + 6] = uVar8;
        local_d0[sVar4 * 8 + 7] = (uchar)a;
      }
      lVar13 = lVar13 + 6;
    }
  }
  else {
    if (mode_out->bitdepth == 8) {
      if (mode_out->colortype == LCT_RGB) {
        uVar3 = 0;
        getPixelColorsRGBA8(local_d0,local_c8,0,in,local_c0);
        goto LAB_001145c4;
      }
      if (mode_out->colortype == LCT_RGBA) {
        getPixelColorsRGBA8(local_d0,local_c8,1,in,local_c0);
        goto LAB_001145c1;
      }
    }
    r = r & 0xff00;
    g = g & 0xff00;
    b = b & 0xff00;
    a = a & 0xff00;
    lVar13 = 2;
    lVar15 = 5;
    for (sVar4 = 0; local_c8 != sVar4; sVar4 = sVar4 + 1) {
      getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,in,sVar4,local_c0);
      switch(mode_out->colortype) {
      case LCT_GREY:
        bits = mode_out->bitdepth;
        if (bits == 0x10) {
          puVar1[sVar4 * 2 + 1] = (byte)r;
          puVar1[sVar4 * 2] = (byte)r;
        }
        else if (bits == 8) {
          puVar1[sVar4] = (byte)r;
        }
        else {
          uVar3 = ~(-1 << ((byte)bits & 0x1f)) & (uint)((byte)r >> (8 - (byte)bits & 0x1f));
LAB_00114796:
          addColorBits(puVar1,sVar4,bits,uVar3);
        }
        break;
      case LCT_RGB:
        if (mode_out->bitdepth == 8) {
          puVar1[lVar13 + -2] = (byte)r;
          puVar1[lVar13 + -1] = (uchar)g;
          puVar1[lVar13] = (uchar)b;
        }
        else {
          puVar1[lVar15 + -4] = (byte)r;
          puVar1[lVar15 + -5] = (byte)r;
          puVar1[lVar15 + -2] = (uchar)g;
          puVar1[lVar15 + -3] = (uchar)g;
          puVar1[lVar15] = (uchar)b;
          puVar1[lVar15 + -1] = (uchar)b;
        }
        break;
      case LCT_PALETTE:
        uVar3 = color_tree_get(&tree,(byte)r,(uchar)g,(uchar)b,(uchar)a);
        if ((int)uVar3 < 0) {
          uVar3 = 0x52;
          goto LAB_001145c4;
        }
        bits = mode_out->bitdepth;
        if (bits != 8) goto LAB_00114796;
        puVar1[sVar4] = (uchar)uVar3;
        break;
      case LCT_GREY_ALPHA:
        if (mode_out->bitdepth == 0x10) {
          puVar1[sVar4 * 4 + 1] = (byte)r;
          puVar1[sVar4 * 4] = (byte)r;
          puVar1[sVar4 * 4 + 3] = (uchar)a;
          puVar1[sVar4 * 4 + 2] = (uchar)a;
        }
        else if (mode_out->bitdepth == 8) {
          puVar1[sVar4 * 2] = (byte)r;
          puVar1[sVar4 * 2 + 1] = (uchar)a;
        }
        break;
      case LCT_RGBA:
        if (mode_out->bitdepth == 8) {
          puVar1[sVar4 * 4] = (byte)r;
          puVar1[sVar4 * 4 + 1] = (uchar)g;
          puVar1[sVar4 * 4 + 2] = (uchar)b;
          puVar1[sVar4 * 4 + 3] = (uchar)a;
        }
        else {
          puVar1[sVar4 * 8 + 1] = (byte)r;
          puVar1[sVar4 * 8] = (byte)r;
          puVar1[sVar4 * 8 + 3] = (uchar)g;
          puVar1[sVar4 * 8 + 2] = (uchar)g;
          puVar1[sVar4 * 8 + 5] = (uchar)b;
          puVar1[sVar4 * 8 + 4] = (uchar)b;
          puVar1[sVar4 * 8 + 7] = (uchar)a;
          puVar1[sVar4 * 8 + 6] = (uchar)a;
        }
      }
      lVar13 = lVar13 + 3;
      lVar15 = lVar15 + 6;
    }
  }
LAB_001145c1:
  uVar3 = 0;
LAB_001145c4:
  if (mode_out->colortype == LCT_PALETTE) {
    color_tree_cleanup(&tree);
  }
  return uVar3;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;
  unsigned error = 0;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      error = rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
      if (error) break;
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return error;
}